

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decay.c
# Opt level: O3

void duckdb_je_decay_reinit(decay_t *decay,nstime_t *cur_time,ssize_t decay_ms)

{
  (decay->time_ms).repr = decay_ms;
  if (0 < decay_ms) {
    duckdb_je_nstime_init(&decay->interval,decay_ms * 1000000);
    duckdb_je_nstime_idivide(&decay->interval,200);
  }
  duckdb_je_nstime_copy(&decay->epoch,cur_time);
  decay->jitter_state = (uint64_t)decay;
  duckdb_je_decay_deadline_init(decay);
  switchD_012e3010::default(&decay->nunpurged,0,0x648);
  return;
}

Assistant:

void
decay_reinit(decay_t *decay, nstime_t *cur_time, ssize_t decay_ms) {
	atomic_store_zd(&decay->time_ms, decay_ms, ATOMIC_RELAXED);
	if (decay_ms > 0) {
		nstime_init(&decay->interval, (uint64_t)decay_ms *
		    KQU(1000000));
		nstime_idivide(&decay->interval, SMOOTHSTEP_NSTEPS);
	}

	nstime_copy(&decay->epoch, cur_time);
	decay->jitter_state = (uint64_t)(uintptr_t)decay;
	decay_deadline_init(decay);
	decay->nunpurged = 0;
	memset(decay->backlog, 0, SMOOTHSTEP_NSTEPS * sizeof(size_t));
}